

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void pager_release_kv_engine(Pager *pPager)

{
  unqlite *pDb;
  unqlite_kv_engine *pChunk;
  unqlite_kv_cursor *pCur;
  _func_void_unqlite_kv_engine_ptr *p_Var1;
  unqlite_kv_io *pChunk_00;
  
  pDb = pPager->pDb;
  pChunk = pPager->pEngine;
  pCur = (pDb->sDB).pCursor;
  if (pCur != (unqlite_kv_cursor *)0x0) {
    unqliteReleaseCursor(pDb,pCur);
    (pDb->sDB).pCursor = (unqlite_kv_cursor *)0x0;
  }
  pChunk_00 = pChunk->pIo;
  p_Var1 = pChunk_00->pMethods->xRelease;
  if (p_Var1 != (_func_void_unqlite_kv_engine_ptr *)0x0) {
    (*p_Var1)(pChunk);
    pChunk_00 = pChunk->pIo;
  }
  SyMemBackendFree(&pPager->pDb->sMem,pChunk_00);
  SyMemBackendFree(&pPager->pDb->sMem,pChunk);
  pPager->pEngine = (unqlite_kv_engine *)0x0;
  return;
}

Assistant:

static void pager_release_kv_engine(Pager *pPager)
{
	unqlite_kv_engine *pEngine = pPager->pEngine;
	unqlite_db *pStorage = &pPager->pDb->sDB;
	if( pStorage->pCursor ){
		/* Release the associated cursor */
		unqliteReleaseCursor(pPager->pDb,pStorage->pCursor);
		pStorage->pCursor = 0;
	}
	if( pEngine->pIo->pMethods->xRelease ){
		pEngine->pIo->pMethods->xRelease(pEngine);
	}
	/* Release the whole instance */
	SyMemBackendFree(&pPager->pDb->sMem,(void *)pEngine->pIo);
	SyMemBackendFree(&pPager->pDb->sMem,(void *)pEngine);
	pPager->pEngine = 0;
}